

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall
cmOrderDirectoriesConstraint::cmOrderDirectoriesConstraint
          (cmOrderDirectoriesConstraint *this,cmOrderDirectories *od,string *file)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string local_80;
  string *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  string *local_38;
  
  this->_vptr_cmOrderDirectoriesConstraint =
       (_func_int **)&PTR__cmOrderDirectoriesConstraint_005bcac8;
  this->OD = od;
  this->GlobalGenerator = od->GlobalGenerator;
  local_38 = &this->FullPath;
  (this->FullPath)._M_dataplus._M_p = (pointer)&(this->FullPath).field_2;
  (this->FullPath)._M_string_length = 0;
  (this->FullPath).field_2._M_local_buf[0] = '\0';
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  (this->Directory)._M_string_length = 0;
  (this->Directory).field_2._M_local_buf[0] = '\0';
  local_60 = (string *)&this->FileName;
  (this->FileName)._M_dataplus._M_p = (pointer)&(this->FileName).field_2;
  (this->FileName)._M_string_length = 0;
  (this->FileName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)local_38);
  lVar4 = std::__cxx11::string::rfind((char *)file,0x47de1c,0xffffffffffffffff);
  if (lVar4 != -1) {
    if ((cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)::
         splitFramework == '\0') &&
       (iVar3 = __cxa_guard_acquire(&cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)
                                     ::splitFramework), iVar3 != 0)) {
      cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[0] = (char *)0x0;
      cmOrderDirectoriesConstraint::splitFramework.regmatch.endp[0] = (char *)0x0;
      cmOrderDirectoriesConstraint::splitFramework.regmatch.searchstring = (char *)0x0;
      cmOrderDirectoriesConstraint::splitFramework.program = (char *)0x0;
      cmsys::RegularExpression::compile
                (&cmOrderDirectoriesConstraint::splitFramework,"^(.*)/(.*).framework/(.*)$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   &cmOrderDirectoriesConstraint::splitFramework,&__dso_handle);
      __cxa_guard_release(&cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)
                           ::splitFramework);
    }
    bVar2 = cmsys::RegularExpression::find
                      (&cmOrderDirectoriesConstraint::splitFramework,(file->_M_dataplus)._M_p,
                       &cmOrderDirectoriesConstraint::splitFramework.regmatch);
    if (bVar2) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      if (cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[3] == (char *)0x0) {
        local_80._M_string_length = 0;
        local_80.field_2._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,
                   cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[3],
                   cmOrderDirectoriesConstraint::splitFramework.regmatch.endp[3]);
      }
      local_58 = &local_48;
      if (cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[2] == (char *)0x0) {
        local_50 = 0;
        local_48 = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[2],
                   cmOrderDirectoriesConstraint::splitFramework.regmatch.endp[2]);
      }
      lVar4 = std::__cxx11::string::find((char *)&local_80,(ulong)local_58,0);
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      paVar5 = &local_80.field_2;
      if (lVar4 != -1) {
        local_80._M_dataplus._M_p = (pointer)paVar5;
        if (cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[1] == (char *)0x0) {
          local_80._M_string_length = 0;
          local_80.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,
                     cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[1],
                     cmOrderDirectoriesConstraint::splitFramework.regmatch.endp[1]);
        }
        std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar5) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                   local_80.field_2._M_local_buf[0]) + 1);
        }
        pcVar1 = (file->_M_dataplus)._M_p;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_80,pcVar1 + (this->Directory)._M_string_length + 1,
                   pcVar1 + file->_M_string_length);
        std::__cxx11::string::operator=(local_60,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                   local_80.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  if ((this->FileName)._M_string_length == 0) {
    cmsys::SystemTools::GetFilenamePath(&local_80,file);
    std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    cmsys::SystemTools::GetFilenameName(&local_80,file);
    std::__cxx11::string::operator=(local_60,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

cmOrderDirectoriesConstraint(cmOrderDirectories* od, std::string const& file)
    : OD(od)
    , GlobalGenerator(od->GlobalGenerator)
  {
    this->FullPath = file;

    if (file.rfind(".framework") != std::string::npos) {
      static cmsys::RegularExpression splitFramework(
        "^(.*)/(.*).framework/(.*)$");
      if (splitFramework.find(file) &&
          (std::string::npos !=
           splitFramework.match(3).find(splitFramework.match(2)))) {
        this->Directory = splitFramework.match(1);
        this->FileName =
          std::string(file.begin() + this->Directory.size() + 1, file.end());
      }
    }

    if (this->FileName.empty()) {
      this->Directory = cmSystemTools::GetFilenamePath(file);
      this->FileName = cmSystemTools::GetFilenameName(file);
    }
  }